

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O1

void __thiscall cfd::core::CfdException::~CfdException(CfdException *this)

{
  ~CfdException(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN _GLIBCXX_USE_NOEXCEPT {
    // do nothing
  }